

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmCommonTargetGenerator::AppendFortranPreprocessFlags
          (cmCommonTargetGenerator *this,string *flags,cmSourceFile *source,
          PreprocessFlagsRequired requires_pp)

{
  cmGeneratorTarget *this_00;
  cmMakefile *this_01;
  cmLocalCommonGenerator *this_02;
  FortranPreprocess FVar1;
  string *psVar2;
  char *__s;
  string_view value;
  string_view value_00;
  string srcpp;
  allocator<char> local_61;
  string local_60;
  char *local_40;
  size_t local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"Fortran_PREPROCESS",&local_61);
  psVar2 = cmSourceFile::GetSafeProperty(source,&local_60);
  std::__cxx11::string::string((string *)&local_40,(string *)psVar2);
  std::__cxx11::string::~string((string *)&local_60);
  value._M_str = local_40;
  value._M_len = local_38;
  FVar1 = cmOutputConverter::GetFortranPreprocess(value);
  if (FVar1 == Unset) {
    this_00 = this->GeneratorTarget;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"Fortran_PREPROCESS",&local_61);
    psVar2 = cmGeneratorTarget::GetSafeProperty(this_00,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    value_00._M_str = (psVar2->_M_dataplus)._M_p;
    value_00._M_len = psVar2->_M_string_length;
    FVar1 = cmOutputConverter::GetFortranPreprocess(value_00);
  }
  if (FVar1 == NotNeeded) {
    __s = "CMAKE_Fortran_COMPILE_OPTIONS_PREPROCESS_OFF";
  }
  else {
    if ((FVar1 != Needed) || (requires_pp != YES)) goto LAB_002df564;
    __s = "CMAKE_Fortran_COMPILE_OPTIONS_PREPROCESS_ON";
  }
  this_01 = this->Makefile;
  this_02 = this->LocalCommonGenerator;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,__s,&local_61);
  psVar2 = cmMakefile::GetSafeDefinition(this_01,&local_60);
  cmLocalGenerator::AppendCompileOptions(&this_02->super_cmLocalGenerator,flags,psVar2,(char *)0x0);
  std::__cxx11::string::~string((string *)&local_60);
LAB_002df564:
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void cmCommonTargetGenerator::AppendFortranPreprocessFlags(
  std::string& flags, cmSourceFile const& source,
  PreprocessFlagsRequired requires_pp)
{
  const std::string srcpp = source.GetSafeProperty("Fortran_PREPROCESS");
  cmOutputConverter::FortranPreprocess preprocess =
    cmOutputConverter::GetFortranPreprocess(srcpp);
  if (preprocess == cmOutputConverter::FortranPreprocess::Unset) {
    std::string const& tgtpp =
      this->GeneratorTarget->GetSafeProperty("Fortran_PREPROCESS");
    preprocess = cmOutputConverter::GetFortranPreprocess(tgtpp);
  }
  const char* var = nullptr;
  switch (preprocess) {
    case cmOutputConverter::FortranPreprocess::Needed:
      if (requires_pp == PreprocessFlagsRequired::YES) {
        var = "CMAKE_Fortran_COMPILE_OPTIONS_PREPROCESS_ON";
      }
      break;
    case cmOutputConverter::FortranPreprocess::NotNeeded:
      var = "CMAKE_Fortran_COMPILE_OPTIONS_PREPROCESS_OFF";
      break;
    default:
      break;
  }
  if (var) {
    this->LocalCommonGenerator->AppendCompileOptions(
      flags, this->Makefile->GetSafeDefinition(var));
  }
}